

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O2

ObjectIDType __thiscall ObjectsContext::StartNewIndirectObject(ObjectsContext *this)

{
  PrimitiveObjectsWriter *this_00;
  bool bVar1;
  int iVar2;
  EStatusCode EVar3;
  ObjectIDType inObjectID;
  undefined4 extraout_var;
  Trace *this_01;
  
  inObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(&this->mReferencesRegistry);
  iVar2 = (*(this->mOutputStream->super_IByteWriter)._vptr_IByteWriter[3])();
  EVar3 = IndirectObjectsReferenceRegistry::MarkObjectAsWritten
                    (&this->mReferencesRegistry,inObjectID,CONCAT44(extraout_var,iVar2));
  if (EVar3 == eSuccess) {
    this_00 = &this->mPrimitiveWriter;
    PrimitiveObjectsWriter::WriteInteger(this_00,inObjectID,eTokenSeparatorSpace);
    PrimitiveObjectsWriter::WriteInteger(this_00,0,eTokenSeparatorSpace);
    PrimitiveObjectsWriter::WriteKeyword(this_00,&scObj_abi_cxx11_);
    bVar1 = IsEncrypting(this);
    if (bVar1) {
      EncryptionHelper::OnObjectStart(this->mEncryptionHelper,inObjectID,0);
    }
  }
  else {
    this_01 = Trace::DefaultTrace();
    Trace::TraceToLog(this_01,
                      "ObjectsContext::StartNewIndirectObject, failed to mark object as written. Object ID = %ld"
                      ,inObjectID);
    inObjectID = 0;
  }
  return inObjectID;
}

Assistant:

ObjectIDType ObjectsContext::StartNewIndirectObject()
{
	ObjectIDType newObjectID = mReferencesRegistry.AllocateNewObjectID();
	EStatusCode status = mReferencesRegistry.MarkObjectAsWritten(newObjectID,mOutputStream->GetCurrentPosition());
	if(status != eSuccess)
	{
		TRACE_LOG1("ObjectsContext::StartNewIndirectObject, failed to mark object as written. Object ID = %ld",newObjectID);
		return 0;
	}
	mPrimitiveWriter.WriteInteger(newObjectID);
	mPrimitiveWriter.WriteInteger(0);
	mPrimitiveWriter.WriteKeyword(scObj);

	if(IsEncrypting()) {
		mEncryptionHelper->OnObjectStart((long long)newObjectID, 0);
	}

	return newObjectID;
}